

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O0

void __thiscall OpenMD::DumpReader::readSiteData(DumpReader *this,istream *inputStream)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  char *in_RSI;
  long in_RDI;
  string line;
  string *in_stack_00000398;
  DumpReader *in_stack_000003a0;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  while( true ) {
    plVar2 = (long *)std::istream::getline(in_RSI,in_RDI + 0x256);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,(char *)(in_RDI + 0x256));
    lVar3 = std::__cxx11::string::find(&stack0xffffffffffffffd0,0x427e34);
    if (lVar3 != -1) break;
    parseSiteLine(in_stack_000003a0,in_stack_00000398);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void DumpReader::readSiteData(std::istream& inputStream) {
    std::string line(buffer);

    // We already found the starting <SiteData> tag or we wouldn't be
    // here, so just start parsing until we get to the ending
    // </SiteData> tag:

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</SiteData>") != std::string::npos) { break; }

      parseSiteLine(line);
    }
  }